

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Namespace * __thiscall flatbuffers::Parser::UniqueNamespace(Parser *this,Namespace *ns)

{
  iterator iVar1;
  bool bVar2;
  reference ppNVar3;
  __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
  local_30;
  __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
  local_28;
  iterator it;
  Namespace *ns_local;
  Parser *this_local;
  
  it._M_current = (Namespace **)ns;
  local_28._M_current =
       (Namespace **)
       std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::begin
                 (&this->namespaces_);
  while( true ) {
    local_30._M_current =
         (Namespace **)
         std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::end
                   (&this->namespaces_);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    iVar1 = it;
    if (!bVar2) {
      std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::push_back
                (&this->namespaces_,(value_type *)&it);
      return (Namespace *)it._M_current;
    }
    ppNVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
              ::operator*(&local_28);
    bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)iVar1._M_current,&(*ppNVar3)->components);
    iVar1 = it;
    if (bVar2) break;
    __gnu_cxx::
    __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
    ::operator++(&local_28);
  }
  if (it._M_current != (Namespace **)0x0) {
    Namespace::~Namespace((Namespace *)it._M_current);
    operator_delete(iVar1._M_current,0x20);
  }
  ppNVar3 = __gnu_cxx::
            __normal_iterator<flatbuffers::Namespace_**,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
            ::operator*(&local_28);
  return *ppNVar3;
}

Assistant:

Namespace *Parser::UniqueNamespace(Namespace *ns) {
  for (auto it = namespaces_.begin(); it != namespaces_.end(); ++it) {
    if (ns->components == (*it)->components) {
      delete ns;
      return *it;
    }
  }
  namespaces_.push_back(ns);
  return ns;
}